

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ProgramStateQueryTests::init
          (ProgramStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  QueryType QVar2;
  ProgramSeparableCase *this_00;
  char *pcVar3;
  ProgramStateQueryTests *pPVar4;
  ComputeWorkGroupSizeCase *this_01;
  ActiveAtomicCounterBuffersCase *this_02;
  GeometryShaderCase *this_03;
  TessellationShaderCase *this_04;
  ProgramLogCase *this_05;
  uint local_1e8;
  allocator<char> local_1e1;
  int ndx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  QueryType local_19c;
  char *pcStack_198;
  QueryType verifier_4;
  char *verifierSuffix_4;
  int verifierNdx_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  QueryType local_144;
  char *pcStack_140;
  QueryType verifier_3;
  char *verifierSuffix_3;
  int verifierNdx_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  QueryType local_ec;
  char *pcStack_e8;
  QueryType verifier_2;
  char *verifierSuffix_2;
  int verifierNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  QueryType local_94;
  char *pcStack_90;
  QueryType verifier_1;
  char *verifierSuffix_1;
  undefined1 local_7d;
  int verifierNdx_1;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  QueryType local_24;
  char *pcStack_20;
  QueryType verifier;
  char *verifierSuffix;
  ProgramStateQueryTests *pPStack_10;
  int verifierNdx;
  ProgramStateQueryTests *this_local;
  
  verifierSuffix._4_4_ = 0;
  pPVar4 = this;
  pPStack_10 = this;
  while ((int)verifierSuffix._4_4_ < 1) {
    pcStack_20 = anon_unknown_1::getVerifierSuffix(init::intVerifiers[(int)verifierSuffix._4_4_]);
    local_24 = init::intVerifiers[(int)verifierSuffix._4_4_];
    this_00 = (ProgramSeparableCase *)operator_new(0x80);
    QVar2 = local_24;
    local_7d = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"program_separable_",&local_69);
    std::operator+(&local_48,&local_68,pcStack_20);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ProgramSeparableCase::ProgramSeparableCase
              (this_00,pCVar1,QVar2,pcVar3,"Test PROGRAM_SEPARABLE");
    local_7d = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    verifierSuffix._4_4_ = verifierSuffix._4_4_ + 1;
    pPVar4 = (ProgramStateQueryTests *)(ulong)verifierSuffix._4_4_;
  }
  verifierSuffix_1._4_4_ = 0;
  while ((int)verifierSuffix_1._4_4_ < 1) {
    pcStack_90 = anon_unknown_1::getVerifierSuffix
                           (init::intVec3Verifiers[(int)verifierSuffix_1._4_4_]);
    local_94 = init::intVec3Verifiers[(int)verifierSuffix_1._4_4_];
    this_01 = (ComputeWorkGroupSizeCase *)operator_new(0x80);
    QVar2 = local_94;
    verifierSuffix_2._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verifierNdx_2,"compute_work_group_size_",
               (allocator<char> *)((long)&verifierSuffix_2 + 7));
    std::operator+(&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_2,pcStack_90);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ComputeWorkGroupSizeCase::ComputeWorkGroupSizeCase
              (this_01,pCVar1,QVar2,pcVar3,"Test COMPUTE_WORK_GROUP_SIZE");
    verifierSuffix_2._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&verifierNdx_2);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_2 + 7));
    verifierSuffix_1._4_4_ = verifierSuffix_1._4_4_ + 1;
    pPVar4 = (ProgramStateQueryTests *)(ulong)verifierSuffix_1._4_4_;
  }
  verifierSuffix_2._0_4_ = 0;
  while ((int)(uint)verifierSuffix_2 < 1) {
    pcStack_e8 = anon_unknown_1::getVerifierSuffix(init::intVerifiers[(int)(uint)verifierSuffix_2]);
    local_ec = init::intVerifiers[(int)(uint)verifierSuffix_2];
    this_02 = (ActiveAtomicCounterBuffersCase *)operator_new(0x80);
    QVar2 = local_ec;
    verifierSuffix_3._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verifierNdx_3,"active_atomic_counter_buffers_",
               (allocator<char> *)((long)&verifierSuffix_3 + 7));
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_3,pcStack_e8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::ActiveAtomicCounterBuffersCase::ActiveAtomicCounterBuffersCase
              (this_02,pCVar1,QVar2,pcVar3,"Test ACTIVE_ATOMIC_COUNTER_BUFFERS");
    verifierSuffix_3._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&verifierNdx_3);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_3 + 7));
    verifierSuffix_2._0_4_ = (uint)verifierSuffix_2 + 1;
    pPVar4 = (ProgramStateQueryTests *)(ulong)(uint)verifierSuffix_2;
  }
  verifierSuffix_3._0_4_ = 0;
  while ((int)(uint)verifierSuffix_3 < 1) {
    pcStack_140 = anon_unknown_1::getVerifierSuffix(init::intVerifiers[(int)(uint)verifierSuffix_3])
    ;
    local_144 = init::intVerifiers[(int)(uint)verifierSuffix_3];
    this_03 = (GeometryShaderCase *)operator_new(0x80);
    QVar2 = local_144;
    verifierSuffix_4._6_1_ = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&verifierNdx_4,"geometry_shader_state_",
               (allocator<char> *)((long)&verifierSuffix_4 + 7));
    std::operator+(&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &verifierNdx_4,pcStack_140);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::GeometryShaderCase::GeometryShaderCase
              (this_03,pCVar1,QVar2,pcVar3,"Test Geometry Shader State");
    verifierSuffix_4._6_1_ = 0;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&verifierNdx_4);
    std::allocator<char>::~allocator((allocator<char> *)((long)&verifierSuffix_4 + 7));
    verifierSuffix_3._0_4_ = (uint)verifierSuffix_3 + 1;
    pPVar4 = (ProgramStateQueryTests *)(ulong)(uint)verifierSuffix_3;
  }
  verifierSuffix_4._0_4_ = 0;
  while ((int)(uint)verifierSuffix_4 < 1) {
    pcStack_198 = anon_unknown_1::getVerifierSuffix(init::intVerifiers[(int)(uint)verifierSuffix_4])
    ;
    local_19c = init::intVerifiers[(int)(uint)verifierSuffix_4];
    this_04 = (TessellationShaderCase *)operator_new(0x80);
    QVar2 = local_19c;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx,"tesselation_shader_state_",&local_1e1);
    std::operator+(&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ndx,
                   pcStack_198);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::TessellationShaderCase::TessellationShaderCase
              (this_04,pCVar1,QVar2,pcVar3,"Test Tesselation Shader State");
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&ndx);
    std::allocator<char>::~allocator(&local_1e1);
    verifierSuffix_4._0_4_ = (uint)verifierSuffix_4 + 1;
    pPVar4 = (ProgramStateQueryTests *)(ulong)(uint)verifierSuffix_4;
  }
  local_1e8 = 0;
  while ((int)local_1e8 < 4) {
    this_05 = (ProgramLogCase *)operator_new(0x80);
    anon_unknown_1::ProgramLogCase::ProgramLogCase
              (this_05,(this->super_TestCaseGroup).m_context,
               init::shaderTypes[(int)local_1e8].caseName,"",
               init::shaderTypes[(int)local_1e8].caseType);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
    local_1e8 = local_1e8 + 1;
    pPVar4 = (ProgramStateQueryTests *)(ulong)local_1e8;
  }
  return (int)pPVar4;
}

Assistant:

void ProgramStateQueryTests::init (void)
{
	static const QueryType intVerifiers[] =
	{
		QUERY_PROGRAM_INTEGER,
	};
	static const QueryType intVec3Verifiers[] =
	{
		QUERY_PROGRAM_INTEGER_VEC3,
	};

#define FOR_EACH_INT_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(intVerifiers); ++verifierNdx)	\
	{																							\
		const char* verifierSuffix = getVerifierSuffix(intVerifiers[verifierNdx]);				\
		const QueryType verifier = intVerifiers[verifierNdx];									\
		this->addChild(X);																		\
	}

#define FOR_EACH_VEC_VERIFIER(X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(intVec3Verifiers); ++verifierNdx)	\
	{																								\
		const char* verifierSuffix = getVerifierSuffix(intVec3Verifiers[verifierNdx]);				\
		const QueryType verifier = intVec3Verifiers[verifierNdx];									\
		this->addChild(X);																			\
	}

	FOR_EACH_INT_VERIFIER(new ProgramSeparableCase				(m_context, verifier, (std::string("program_separable_") + verifierSuffix).c_str(),				"Test PROGRAM_SEPARABLE"));
	FOR_EACH_VEC_VERIFIER(new ComputeWorkGroupSizeCase			(m_context, verifier, (std::string("compute_work_group_size_") + verifierSuffix).c_str(),		"Test COMPUTE_WORK_GROUP_SIZE"));
	FOR_EACH_INT_VERIFIER(new ActiveAtomicCounterBuffersCase	(m_context, verifier, (std::string("active_atomic_counter_buffers_") + verifierSuffix).c_str(),	"Test ACTIVE_ATOMIC_COUNTER_BUFFERS"));
	FOR_EACH_INT_VERIFIER(new GeometryShaderCase				(m_context, verifier, (std::string("geometry_shader_state_") + verifierSuffix).c_str(),			"Test Geometry Shader State"));
	FOR_EACH_INT_VERIFIER(new TessellationShaderCase			(m_context, verifier, (std::string("tesselation_shader_state_") + verifierSuffix).c_str(),		"Test Tesselation Shader State"));

#undef FOR_EACH_INT_VERIFIER
#undef FOR_EACH_VEC_VERIFIER

	// program info log tests
	// \note, there exists similar tests in gles3 module. However, the gles31 could use a different
	//        shader compiler with different INFO_LOG bugs.
	{
		static const struct
		{
			const char*						caseName;
			ProgramLogCase::BuildErrorType	caseType;
		} shaderTypes[] =
		{
			{ "info_log_vertex_fragment_link_fail",		ProgramLogCase::BUILDERROR_VERTEX_FRAGMENT	},
			{ "info_log_compute_link_fail",				ProgramLogCase::BUILDERROR_COMPUTE			},
			{ "info_log_geometry_link_fail",			ProgramLogCase::BUILDERROR_GEOMETRY			},
			{ "info_log_tessellation_link_fail",		ProgramLogCase::BUILDERROR_TESSELLATION		},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
			addChild(new ProgramLogCase(m_context, shaderTypes[ndx].caseName, "", shaderTypes[ndx].caseType));
	}
}